

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolemaskproxymodel.cpp
# Opt level: O0

void __thiscall RoleMaskProxyModel::clearMaskedData(RoleMaskProxyModel *this,QModelIndex *index)

{
  bool bVar1;
  FlaggedRolesContainer *this_00;
  undefined1 local_70 [7];
  bool valueOfExpression;
  QVector<int> changedRoles;
  QList<int> changedRolesList;
  FlaggedRolesContainer *maskedIter;
  QModelIndex sourceIndex;
  RoleMaskProxyModelPrivate *d;
  QModelIndex *index_local;
  RoleMaskProxyModel *this_local;
  
  bVar1 = QModelIndex::isValid(index);
  if (bVar1) {
    sourceIndex.m = (QAbstractItemModel *)d_func(this);
    (**(code **)(*(long *)this + 400))(&maskedIter,this,index);
    this_00 = RoleMaskProxyModelPrivate::dataForIndex
                        ((RoleMaskProxyModelPrivate *)sourceIndex.m,(QModelIndex *)&maskedIter);
    if (this_00 != (FlaggedRolesContainer *)0x0) {
      QMap<int,_QVariant>::keys((QList<int> *)&changedRoles.d.size,&this_00->roles);
      QList<int>::toVector((QList<int> *)local_70,(QList<int> *)&changedRoles.d.size);
      RoleMaskProxyModelPrivate::removeIndex
                ((RoleMaskProxyModelPrivate *)sourceIndex.m,(QModelIndex *)&maskedIter);
      maskedDataChanged(this,index,index,(QVector<int> *)local_70);
      QAbstractItemModel::dataChanged
                ((QModelIndex *)this,(QModelIndex *)index,(QList_conflict2 *)index);
      QList<int>::~QList((QList<int> *)local_70);
      QList<int>::~QList((QList<int> *)&changedRoles.d.size);
    }
  }
  return;
}

Assistant:

void RoleMaskProxyModel::clearMaskedData(const QModelIndex &index)
{
    if (!index.isValid())
        return;
    Q_ASSERT(index.model() == this);
    Q_D(RoleMaskProxyModel);
    const QModelIndex sourceIndex = mapToSource(index);
    const FlaggedRolesContainer *maskedIter = d->dataForIndex(sourceIndex);
    if (!maskedIter)
        return;
    Q_ASSERT(!maskedIter->roles.isEmpty());
    const QList<int> changedRolesList = maskedIter->roles.keys();
    const QVector<int> changedRoles = changedRolesList.toVector();
    Q_ASSUME(d->removeIndex(sourceIndex));
    maskedDataChanged(index, index, changedRoles);
    dataChanged(index, index, changedRoles);
}